

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

Stream * rw::wdgl::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  uint32 uVar1;
  undefined4 *puVar2;
  void *data;
  undefined8 uVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 253"
  ;
  puVar2 = (undefined4 *)(*DAT_00149858)(0x28,0x3000f,object,CONCAT44(in_register_0000000c,param_4))
  ;
  *(undefined4 **)((long)object + 0x98) = puVar2;
  *puVar2 = 0xb;
  *(undefined8 *)(puVar2 + 8) = 0;
  uVar1 = Stream::readU32(stream);
  puVar2[1] = uVar1;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 259"
  ;
  data = (void *)(*DAT_00149858)((long)(int)uVar1 * 0x18,0x3000f);
  *(void **)(puVar2 + 2) = data;
  Stream::read32(stream,data,puVar2[1] * 0x18);
  iVar4 = *(int *)((long)object + 0x1c) * *(int *)(*(long *)(puVar2 + 2) + 0x10);
  puVar2[4] = iVar4;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/gl/wdgl.cpp line: 263"
  ;
  uVar3 = (*DAT_00149858)(iVar4,0x3000f);
  *(undefined8 *)(puVar2 + 6) = uVar3;
  (*stream->_vptr_Stream[4])(stream,uVar3,(ulong)(uint)puVar2[4]);
  return stream;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	Geometry *geometry = (Geometry*)object;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_WDGL;
	header->vbo = 0;
	header->ibo = 0;
	header->numAttribs = stream->readU32();
	header->attribs = rwNewT(AttribDesc, header->numAttribs, MEMDUR_EVENT | ID_GEOMETRY);
	stream->read32(header->attribs,
	            header->numAttribs*sizeof(AttribDesc));
	header->dataSize = header->attribs[0].stride*geometry->numVertices;
	header->data = rwNewT(uint8, header->dataSize, MEMDUR_EVENT | ID_GEOMETRY);
	ASSERTLITTLE;
	stream->read8(header->data, header->dataSize);
	return stream;
}